

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_index.h
# Opt level: O2

void __thiscall S2PointIndex<int>::Add(S2PointIndex<int> *this,PointData *point_data)

{
  S2CellId id;
  S2CellId local_48;
  pair<const_S2CellId,_S2PointIndex<int>::PointData> local_40;
  
  S2CellId::S2CellId(&local_48,
                     &(point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl);
  local_40.second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)
       (point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.super__Tuple_impl<1UL,_int>
       .super__Head_base<1UL,_int,_false>._M_head_impl;
  local_40.first.id_ = local_48.id_;
  local_40.second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
  super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0] =
       (point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
       super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0];
  local_40.second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
  super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1] =
       (point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
       super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1];
  local_40.second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
  super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2] =
       (point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
       super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2];
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
  ::insert_multi<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>
            ((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              *)this,&local_40);
  return;
}

Assistant:

void S2PointIndex<Data>::Add(const PointData& point_data) {
  S2CellId id(point_data.point());
  map_.insert(std::make_pair(id, point_data));
}